

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_common(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  int64_t iVar2;
  wchar_t local_40;
  wchar_t err;
  char tartype;
  archive_entry_header_ustar *header;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  local_40 = L'\0';
  if (*(char *)((long)h + 0x9d) == '\0') {
    (tar->entry_linkpath).length = 0;
  }
  else {
    (tar->entry_linkpath).length = 0;
    archive_strncat(&tar->entry_linkpath,(void *)((long)h + 0x9d),100);
  }
  iVar2 = tar_atol((char *)((long)h + 100),8);
  archive_entry_set_mode(entry,(mode_t)iVar2);
  iVar2 = tar_atol((char *)((long)h + 0x6c),8);
  archive_entry_set_uid(entry,iVar2);
  iVar2 = tar_atol((char *)((long)h + 0x74),8);
  archive_entry_set_gid(entry,iVar2);
  iVar2 = tar_atol((char *)((long)h + 0x7c),0xc);
  tar->entry_bytes_remaining = iVar2;
  if (tar->entry_bytes_remaining < 0) {
    tar->entry_bytes_remaining = 0;
    archive_set_error(&a->archive,-1,"Tar entry has negative size?");
    local_40 = L'\xffffffec';
  }
  tar->realsize = tar->entry_bytes_remaining;
  archive_entry_set_size(entry,tar->entry_bytes_remaining);
  iVar2 = tar_atol((char *)((long)h + 0x88),0xc);
  archive_entry_set_mtime(entry,iVar2,0);
  switch(*(undefined1 *)((long)h + 0x9c)) {
  case 0x31:
    wVar1 = _archive_entry_copy_hardlink_l
                      (entry,(tar->entry_linkpath).s,(tar->entry_linkpath).length,tar->sconv);
    if ((wVar1 != L'\0') &&
       (local_40 = set_conversion_failed_error(a,tar->sconv,"Linkname"), local_40 == L'\xffffffe2'))
    {
      return L'\xffffffe2';
    }
    iVar2 = archive_entry_size(entry);
    if (0 < iVar2) {
      archive_entry_set_filetype(entry,0x8000);
    }
    iVar2 = archive_entry_size(entry);
    if ((iVar2 != 0) && ((a->archive).archive_format != 0x30002)) {
      if (((a->archive).archive_format == 0x30000) || ((a->archive).archive_format == 0x30004)) {
        archive_entry_set_size(entry,0);
        tar->entry_bytes_remaining = 0;
      }
      else {
        wVar1 = archive_read_format_tar_bid(a,L'2');
        if (L'2' < wVar1) {
          archive_entry_set_size(entry,0);
          tar->entry_bytes_remaining = 0;
        }
      }
    }
    break;
  case 0x32:
    archive_entry_set_filetype(entry,0xa000);
    archive_entry_set_size(entry,0);
    tar->entry_bytes_remaining = 0;
    wVar1 = _archive_entry_copy_symlink_l
                      (entry,(tar->entry_linkpath).s,(tar->entry_linkpath).length,tar->sconv);
    if ((wVar1 != L'\0') &&
       (local_40 = set_conversion_failed_error(a,tar->sconv,"Linkname"), local_40 == L'\xffffffe2'))
    {
      return L'\xffffffe2';
    }
    break;
  case 0x33:
    archive_entry_set_filetype(entry,0x2000);
    archive_entry_set_size(entry,0);
    tar->entry_bytes_remaining = 0;
    break;
  case 0x34:
    archive_entry_set_filetype(entry,0x6000);
    archive_entry_set_size(entry,0);
    tar->entry_bytes_remaining = 0;
    break;
  case 0x35:
    archive_entry_set_filetype(entry,0x4000);
    archive_entry_set_size(entry,0);
    tar->entry_bytes_remaining = 0;
    break;
  case 0x36:
    archive_entry_set_filetype(entry,0x1000);
    archive_entry_set_size(entry,0);
    tar->entry_bytes_remaining = 0;
    break;
  case 0x44:
    archive_entry_set_filetype(entry,0x4000);
    break;
  case 0x4d:
    break;
  case 0x4e:
    archive_entry_set_filetype(entry,0x8000);
    break;
  case 0x53:
  default:
    archive_entry_set_filetype(entry,0x8000);
  }
  return local_40;
}

Assistant:

static int
header_common(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	char	tartype;
	int     err = ARCHIVE_OK;

	header = (const struct archive_entry_header_ustar *)h;
	if (header->linkname[0])
		archive_strncpy(&(tar->entry_linkpath),
		    header->linkname, sizeof(header->linkname));
	else
		archive_string_empty(&(tar->entry_linkpath));

	/* Parse out the numeric fields (all are octal) */
	archive_entry_set_mode(entry,
		(mode_t)tar_atol(header->mode, sizeof(header->mode)));
	archive_entry_set_uid(entry, tar_atol(header->uid, sizeof(header->uid)));
	archive_entry_set_gid(entry, tar_atol(header->gid, sizeof(header->gid)));
	tar->entry_bytes_remaining = tar_atol(header->size, sizeof(header->size));
	if (tar->entry_bytes_remaining < 0) {
		tar->entry_bytes_remaining = 0;
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Tar entry has negative size?");
		err = ARCHIVE_WARN;
	}
	tar->realsize = tar->entry_bytes_remaining;
	archive_entry_set_size(entry, tar->entry_bytes_remaining);
	archive_entry_set_mtime(entry, tar_atol(header->mtime, sizeof(header->mtime)), 0);

	/* Handle the tar type flag appropriately. */
	tartype = header->typeflag[0];

	switch (tartype) {
	case '1': /* Hard link */
		if (archive_entry_copy_hardlink_l(entry, tar->entry_linkpath.s,
		    archive_strlen(&(tar->entry_linkpath)), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv,
			    "Linkname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
		/*
		 * The following may seem odd, but: Technically, tar
		 * does not store the file type for a "hard link"
		 * entry, only the fact that it is a hard link.  So, I
		 * leave the type zero normally.  But, pax interchange
		 * format allows hard links to have data, which
		 * implies that the underlying entry is a regular
		 * file.
		 */
		if (archive_entry_size(entry) > 0)
			archive_entry_set_filetype(entry, AE_IFREG);

		/*
		 * A tricky point: Traditionally, tar readers have
		 * ignored the size field when reading hardlink
		 * entries, and some writers put non-zero sizes even
		 * though the body is empty.  POSIX blessed this
		 * convention in the 1988 standard, but broke with
		 * this tradition in 2001 by permitting hardlink
		 * entries to store valid bodies in pax interchange
		 * format, but not in ustar format.  Since there is no
		 * hard and fast way to distinguish pax interchange
		 * from earlier archives (the 'x' and 'g' entries are
		 * optional, after all), we need a heuristic.
		 */
		if (archive_entry_size(entry) == 0) {
			/* If the size is already zero, we're done. */
		}  else if (a->archive.archive_format
		    == ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE) {
			/* Definitely pax extended; must obey hardlink size. */
		} else if (a->archive.archive_format == ARCHIVE_FORMAT_TAR
		    || a->archive.archive_format == ARCHIVE_FORMAT_TAR_GNUTAR)
		{
			/* Old-style or GNU tar: we must ignore the size. */
			archive_entry_set_size(entry, 0);
			tar->entry_bytes_remaining = 0;
		} else if (archive_read_format_tar_bid(a, 50) > 50) {
			/*
			 * We don't know if it's pax: If the bid
			 * function sees a valid ustar header
			 * immediately following, then let's ignore
			 * the hardlink size.
			 */
			archive_entry_set_size(entry, 0);
			tar->entry_bytes_remaining = 0;
		}
		/*
		 * TODO: There are still two cases I'd like to handle:
		 *   = a ustar non-pax archive with a hardlink entry at
		 *     end-of-archive.  (Look for block of nulls following?)
		 *   = a pax archive that has not seen any pax headers
		 *     and has an entry which is a hardlink entry storing
		 *     a body containing an uncompressed tar archive.
		 * The first is worth addressing; I don't see any reliable
		 * way to deal with the second possibility.
		 */
		break;
	case '2': /* Symlink */
		archive_entry_set_filetype(entry, AE_IFLNK);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		if (archive_entry_copy_symlink_l(entry, tar->entry_linkpath.s,
		    archive_strlen(&(tar->entry_linkpath)), tar->sconv) != 0) {
			err = set_conversion_failed_error(a, tar->sconv,
			    "Linkname");
			if (err == ARCHIVE_FATAL)
				return (err);
		}
		break;
	case '3': /* Character device */
		archive_entry_set_filetype(entry, AE_IFCHR);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '4': /* Block device */
		archive_entry_set_filetype(entry, AE_IFBLK);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '5': /* Dir */
		archive_entry_set_filetype(entry, AE_IFDIR);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case '6': /* FIFO device */
		archive_entry_set_filetype(entry, AE_IFIFO);
		archive_entry_set_size(entry, 0);
		tar->entry_bytes_remaining = 0;
		break;
	case 'D': /* GNU incremental directory type */
		/*
		 * No special handling is actually required here.
		 * It might be nice someday to preprocess the file list and
		 * provide it to the client, though.
		 */
		archive_entry_set_filetype(entry, AE_IFDIR);
		break;
	case 'M': /* GNU "Multi-volume" (remainder of file from last archive)*/
		/*
		 * As far as I can tell, this is just like a regular file
		 * entry, except that the contents should be _appended_ to
		 * the indicated file at the indicated offset.  This may
		 * require some API work to fully support.
		 */
		break;
	case 'N': /* Old GNU "long filename" entry. */
		/* The body of this entry is a script for renaming
		 * previously-extracted entries.  Ugh.  It will never
		 * be supported by libarchive. */
		archive_entry_set_filetype(entry, AE_IFREG);
		break;
	case 'S': /* GNU sparse files */
		/*
		 * Sparse files are really just regular files with
		 * sparse information in the extended area.
		 */
		/* FALLTHROUGH */
	default: /* Regular file  and non-standard types */
		/*
		 * Per POSIX: non-recognized types should always be
		 * treated as regular files.
		 */
		archive_entry_set_filetype(entry, AE_IFREG);
		break;
	}
	return (err);
}